

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
module_reverse_csv_actions::header_start(module_reverse_csv_actions *this,string *header)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->module_)._M_dataplus._M_p,
                      (this->module_)._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
                      s_csv_separator_abi_cxx11_._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(header->_M_dataplus)._M_p,header->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
             s_csv_separator_abi_cxx11_._M_string_length);
  this->first_header_ = true;
  return;
}

Assistant:

void header_start( std::string const & header )
    {
        std::cout << module_ << s_csv_separator << header << s_csv_separator;
        first_header_ = true;
    }